

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_search.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
::search_nearest(search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  bool bVar1;
  metric_l2_squared *this_00;
  scalar_type *psVar2;
  scalar_type *psVar3;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar4;
  scalar_type sVar5;
  scalar_type old_offset;
  node_type *node_2nd;
  node_type *node_1st;
  scalar_type new_offset;
  scalar_type v;
  size_t split_dim;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float fVar6;
  metric_l2_squared *in_stack_ffffffffffffff70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78
  ;
  float local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffe0;
  scalar_type node_box_distance_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  node_box_distance_00 = (scalar_type)((ulong)in_stack_ffffffffffffffe0._M_current >> 0x20);
  bVar1 = kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>::is_leaf
                    ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_> *)
                     in_RSI);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff78,(difference_type)in_stack_ffffffffffffff70);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff78,(difference_type)in_stack_ffffffffffffff70);
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
          bVar1) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      in_stack_ffffffffffffff70 = (metric_l2_squared *)(in_RDI + 8);
      psVar2 = point_wrapper<float[3]>::begin((point_wrapper<float[3]> *)0x1084e2);
      this_00 = (metric_l2_squared *)
                point_wrapper<float[3]>::end((point_wrapper<float[3]> *)in_stack_ffffffffffffff70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
      ::operator[]<int>((space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c);
      metric_l2_squared::operator()
                (this_00,psVar2,(float *)in_stack_ffffffffffffff70,
                 (float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      search_nn<pico_tree::neighbor<int,_float>_>::operator()
                ((search_nn<pico_tree::neighbor<int,_float>_> *)this_00,
                 (index_type)((ulong)psVar2 >> 0x20),SUB84(psVar2,0));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
  }
  else {
    psVar2 = point_wrapper<float[3]>::operator[]
                       ((point_wrapper<float[3]> *)in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (((*(float *)((long)&in_RSI->indices_ + 4) + *(float *)&(in_RSI->query_).point_) - *psVar2) -
        *psVar2 <= 0.0) {
      local_48 = metric_l2_squared::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    else {
      local_48 = metric_l2_squared::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    search_nearest(in_RSI,(node_type *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                   node_box_distance_00);
    psVar3 = point<float,_3UL>::operator[]
                       ((point<float,_3UL> *)in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    fVar6 = *psVar3;
    fVar4 = (in_XMM0_Da - fVar6) + local_48;
    sVar5 = search_nn<pico_tree::neighbor<int,_float>_>::max
                      (*(search_nn<pico_tree::neighbor<int,_float>_> **)(in_RDI + 0x30));
    if (fVar4 <= sVar5) {
      psVar3 = point<float,_3UL>::operator[]
                         ((point<float,_3UL> *)in_stack_ffffffffffffff70,
                          CONCAT44(in_stack_ffffffffffffff6c,local_48));
      *psVar3 = local_48;
      search_nearest(in_RSI,(node_type *)CONCAT44(fVar4,in_stack_ffffffffffffffe8),
                     node_box_distance_00);
      psVar3 = point<float,_3UL>::operator[]
                         ((point<float,_3UL> *)in_stack_ffffffffffffff70,CONCAT44(fVar6,local_48));
      *psVar3 = fVar6;
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      size_t const split_dim = static_cast<size_t>(node->data.branch.split_dim);
      scalar_type const v = query_[split_dim];
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      scalar_type const old_offset = node_box_offset_[split_dim];
      node_box_distance = node_box_distance - old_offset + new_offset;

      // The value visitor->max() contains the current nearest neighbor distance
      // or otherwise current maximum search distance. When testing against the
      // split value we determine if we should go into the neighboring node.
      if (visitor_.max() >= node_box_distance) {
        node_box_offset_[split_dim] = new_offset;
        search_nearest(node_2nd, node_box_distance);
        node_box_offset_[split_dim] = old_offset;
      }
    }
  }